

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O3

void __thiscall pager::pager(pager *this,string *fileName)

{
  pointer pcVar1;
  long *local_48 [2];
  long local_38 [2];
  
  (this->_fileName)._M_dataplus._M_p = (pointer)&(this->_fileName).field_2;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + fileName->_M_string_length);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"r+","");
  r_file::open(&this->_f,(char *)fileName,(int)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  map_page_from(&this->_mm,this,0);
  return;
}

Assistant:

pager::pager(const std::string& fileName) :
    _fileName(fileName),
    _f(r_file::open(fileName, "r+")),
    _mm(map_page_from(0))
{
}